

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall Dice::Dice(Dice *this)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>
  *this_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>
  __l;
  initializer_list<std::pair<const_Dice::DiceOptions,_int>_> __l_00;
  initializer_list<std::pair<const_Dice::DiceOptions,_int>_> __l_01;
  time_t tVar1;
  DiceEffectsObserver *this_01;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  *local_288;
  __normal_iterator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_*,_std::vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>_>
  local_238;
  iterator it;
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  historyOfRolls;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  DiceValues;
  DiceOptions local_1e0 [6];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  *local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  local_f8;
  iterator local_d0;
  size_type local_c8;
  allocator<std::pair<const_Dice::DiceOptions,_int>_> local_ba;
  less<Dice::DiceOptions> local_b9;
  pair<const_Dice::DiceOptions,_int> local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  iterator local_80;
  size_type local_78;
  allocator<std::pair<const_Dice::DiceOptions,_int>_> local_5a;
  less<Dice::DiceOptions> local_59;
  pair<const_Dice::DiceOptions,_int> local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  iterator local_20;
  size_type local_18;
  Dice *local_10;
  Dice *this_local;
  
  local_10 = this;
  Subject::Subject(&this->super_Subject);
  (this->super_Subject)._vptr_Subject = (_func_int **)&PTR_attach_0014c8c0;
  this->DiceNames[4] = "Celebrity";
  this->DiceNames[5] = "Ouch";
  this->DiceNames[2] = "Destruction";
  this->DiceNames[3] = "Heal";
  this->DiceNames[0] = "Energy";
  this->DiceNames[1] = "Attack";
  local_38 = 4;
  uStack_30 = 5;
  local_48 = 2;
  uStack_40 = 3;
  local_58.first = Energy;
  local_58.second = 0;
  uStack_50 = 1;
  local_20 = &local_58;
  local_18 = 6;
  std::allocator<std::pair<const_Dice::DiceOptions,_int>_>::allocator(&local_5a);
  __l_01._M_len = local_18;
  __l_01._M_array = local_20;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::map(&this->DiceValues,__l_01,&local_59,&local_5a);
  std::allocator<std::pair<const_Dice::DiceOptions,_int>_>::~allocator(&local_5a);
  local_98 = 4;
  uStack_90 = 5;
  local_a8 = 2;
  uStack_a0 = 3;
  local_b8.first = Energy;
  local_b8.second = 0;
  uStack_b0._0_4_ = Attack;
  uStack_b0._4_4_ = 0;
  local_80 = &local_b8;
  local_78 = 6;
  std::allocator<std::pair<const_Dice::DiceOptions,_int>_>::allocator(&local_ba);
  __l_00._M_len = local_78;
  __l_00._M_array = local_80;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::map(&this->resolvedHand,__l_00,&local_b9,&local_ba);
  std::allocator<std::pair<const_Dice::DiceOptions,_int>_>::~allocator(&local_ba);
  std::_Rb_tree_iterator<std::pair<const_Dice::DiceOptions,_int>_>::_Rb_tree_iterator(&this->mapIt);
  std::
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ::vector(&this->historyOfResolvedRolls);
  std::
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ::vector(&this->historyOfRolls);
  __gnu_cxx::
  __normal_iterator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_*,_std::vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>_>
  ::__normal_iterator(&this->it);
  this->totalDiceValues[0] = 0;
  this->totalDiceValues[1] = 0;
  this->totalDiceValues[2] = 0;
  this->totalDiceValues[3] = 0;
  this->totalDiceValues[4] = 0;
  this->totalDiceValues[5] = 0;
  local_1c8 = &local_1c0;
  local_1e0[5] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>(local_1c8,(char (*) [2])"A",local_1e0 + 5);
  local_1c8 = &local_198;
  local_1e0[4] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>(local_1c8,(char (*) [2])0x13524d,local_1e0 + 4)
  ;
  local_1c8 = &local_170;
  local_1e0[3] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>(local_1c8,(char (*) [2])"D",local_1e0 + 3);
  local_1c8 = &local_148;
  local_1e0[2] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>(local_1c8,(char (*) [2])"H",local_1e0 + 2);
  local_1c8 = &local_120;
  local_1e0[1] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>(local_1c8,(char (*) [2])"C",local_1e0 + 1);
  local_1c8 = &local_f8;
  local_1e0[0] = Ouch;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
  ::pair<const_char_(&)[2],_Dice::DiceOptions,_true>(local_1c8,(char (*) [2])0x1350da,local_1e0);
  local_d0 = &local_1c0;
  local_c8 = 6;
  this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>
             *)((long)&DiceValues._M_t._M_impl.super__Rb_tree_header._M_node_count + 6);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>
  ::allocator(this_00);
  __l._M_len = local_c8;
  __l._M_array = local_d0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>_>
  ::map(&this->diceMap,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        ((long)&DiceValues._M_t._M_impl.super__Rb_tree_header._M_node_count + 7),this_00);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>
                *)((long)&DiceValues._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
  local_288 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
               *)&local_d0;
  do {
    local_288 = local_288 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>
    ::~pair(local_288);
  } while (local_288 != &local_1c0);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  this->numberOfRolls = 3;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::map((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
         *)&historyOfRolls.
            super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ::vector((vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
            *)&it);
  __gnu_cxx::
  __normal_iterator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_*,_std::vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>_>
  ::__normal_iterator(&local_238);
  this_01 = (DiceEffectsObserver *)operator_new(0x10);
  DiceEffectsObserver::DiceEffectsObserver(this_01,&this->super_Subject);
  (**(this->super_Subject)._vptr_Subject)(this,this_01);
  std::
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ::~vector((vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
             *)&it);
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~map((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
          *)&historyOfRolls.
             super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

Dice::Dice() {
    srand((unsigned)time(0));
    numberOfRolls = 3;

    map<DiceOptions, int> DiceValues;
    vector< map < DiceOptions, int> > historyOfRolls;

    vector< map < DiceOptions, int> > ::iterator it;

    // Attach the observer
    attach(new DiceEffectsObserver(this));

}